

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_helper.h
# Opt level: O2

uchar Test_Helper::randomValue<unsigned_char>(uchar minimum,uint32_t maximum)

{
  uchar uVar1;
  uint uVar2;
  
  if (maximum != 0) {
    uVar2 = rand();
    uVar1 = (uchar)((ulong)uVar2 % (ulong)maximum);
    if (((uint)((ulong)uVar2 % (ulong)maximum) & 0xff) < (uint)minimum) {
      uVar1 = minimum;
    }
    return uVar1;
  }
  return '\0';
}

Assistant:

data randomValue( data minimum, uint32_t maximum )
    {
        if( maximum == 0 ) {
            return 0;
        }
        else {
            data value = static_cast<data>(static_cast<uint32_t>(rand()) % maximum);

            if( value < minimum )
                value = minimum;

            return value;
        }
    }